

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall
irr::video::CNullDriver::draw3DBox(CNullDriver *this,aabbox3d<float> *box,SColor color)

{
  undefined4 in_EDX;
  long *in_RDI;
  vector3df edges [8];
  vector3d<float> *local_b0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector3d<float> local_78;
  undefined1 auStack_6c [12];
  undefined1 auStack_60 [12];
  undefined1 auStack_54 [12];
  undefined1 auStack_48 [12];
  undefined1 auStack_3c [12];
  undefined1 auStack_30 [12];
  undefined1 auStack_24 [12];
  vector3d<float> local_18;
  undefined4 local_4;
  
  local_b0 = &local_78;
  local_4 = in_EDX;
  do {
    core::vector3d<float>::vector3d(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != &local_18);
  core::aabbox3d<float>::getEdges
            ((aabbox3d<float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (vector3d<float> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_3c,auStack_6c,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_6c,auStack_54,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_54,auStack_24,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_24,auStack_3c,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,&local_78,auStack_60,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_60,auStack_30,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_30,auStack_48,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_48,&local_78,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_6c,&local_78,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_54,auStack_60,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_24,auStack_30,local_4);
  (**(code **)(*in_RDI + 0x168))(in_RDI,auStack_3c,auStack_48,local_4);
  return;
}

Assistant:

void CNullDriver::draw3DBox(const core::aabbox3d<f32> &box, SColor color)
{
	core::vector3df edges[8];
	box.getEdges(edges);

	// TODO: optimize into one big drawIndexPrimitive call.

	draw3DLine(edges[5], edges[1], color);
	draw3DLine(edges[1], edges[3], color);
	draw3DLine(edges[3], edges[7], color);
	draw3DLine(edges[7], edges[5], color);
	draw3DLine(edges[0], edges[2], color);
	draw3DLine(edges[2], edges[6], color);
	draw3DLine(edges[6], edges[4], color);
	draw3DLine(edges[4], edges[0], color);
	draw3DLine(edges[1], edges[0], color);
	draw3DLine(edges[3], edges[2], color);
	draw3DLine(edges[7], edges[6], color);
	draw3DLine(edges[5], edges[4], color);
}